

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

void __thiscall
llm_graph_input_k_shift::set_input(llm_graph_input_k_shift *this,llama_ubatch *ubatch)

{
  long lVar1;
  const_reference pvVar2;
  long in_RDI;
  uint32_t i;
  int32_t *data;
  uint local_1c;
  
  if (*(long *)(in_RDI + 8) != 0) {
    lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0xf8);
    for (local_1c = 0; local_1c < *(uint *)(*(long *)(in_RDI + 0x10) + 0x6c);
        local_1c = local_1c + 1) {
      pvVar2 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                         ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)
                          (*(long *)(in_RDI + 0x10) + 0x78),(ulong)local_1c);
      *(llama_pos *)(lVar1 + (ulong)local_1c * 4) = pvVar2->delta;
    }
  }
  return;
}

Assistant:

void llm_graph_input_k_shift::set_input(const llama_ubatch * ubatch) {
    GGML_UNUSED(ubatch);

    if (k_shift) {
        assert(ggml_backend_buffer_is_host(k_shift->buffer));

        int32_t * data = (int32_t *) k_shift->data;

        for (uint32_t i = 0; i < kv_self->size; ++i) {
            data[i] = kv_self->cells[i].delta;
        }
    }
}